

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glTF2Importer.cpp
# Opt level: O0

void __thiscall Assimp::glTF2Importer::ImportAnimations(glTF2Importer *this,Asset *r)

{
  _Hash_node_base *p_Var1;
  undefined1 auVar2 [16];
  bool bVar3;
  uint uVar4;
  ulong uVar5;
  aiAnimation **ppaVar6;
  Animation *anim_00;
  aiAnimation *this_00;
  size_type sVar7;
  _Hash_node_base *p_Var8;
  Node *node;
  aiNodeAnim *paVar9;
  uint *puVar10;
  _Hash_node_base *local_150;
  aiVectorKey lastScaleKey;
  aiQuatKey lastRotKey;
  aiVectorKey lastPosKey;
  aiNodeAnim *chan;
  uint j_1;
  uint maxNumberOfKeys;
  double maxDuration;
  pair<const_unsigned_int,_AnimationSamplers> *iter;
  iterator __end3;
  iterator __begin3;
  unordered_map<unsigned_int,_AnimationSamplers,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_AnimationSamplers>_>_>
  *__range3;
  int j;
  undefined1 local_68 [8];
  unordered_map<unsigned_int,_AnimationSamplers,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_AnimationSamplers>_>_>
  samplers;
  aiAnimation *ai_anim;
  Animation *anim;
  uint i;
  Asset *r_local;
  glTF2Importer *this_local;
  
  bVar3 = glTF2::Ref::operator_cast_to_bool((Ref *)&r->scene);
  if (bVar3) {
    uVar4 = glTF2::LazyDict<glTF2::Animation>::Size(&r->animations);
    this->mScene->mNumAnimations = uVar4;
    if (this->mScene->mNumAnimations != 0) {
      auVar2 = ZEXT416(this->mScene->mNumAnimations) * ZEXT816(8);
      uVar5 = auVar2._0_8_;
      if (auVar2._8_8_ != 0) {
        uVar5 = 0xffffffffffffffff;
      }
      ppaVar6 = (aiAnimation **)operator_new__(uVar5);
      this->mScene->mAnimations = ppaVar6;
      for (anim._4_4_ = 0; uVar4 = glTF2::LazyDict<glTF2::Animation>::Size(&r->animations),
          anim._4_4_ < uVar4; anim._4_4_ = anim._4_4_ + 1) {
        anim_00 = glTF2::LazyDict<glTF2::Animation>::operator[](&r->animations,(ulong)anim._4_4_);
        this_00 = (aiAnimation *)operator_new(0x448);
        aiAnimation::aiAnimation(this_00);
        samplers._M_h._M_single_bucket = (__node_base_ptr)this_00;
        aiString::operator=((aiString *)this_00,&(anim_00->super_Object).name);
        samplers._M_h._M_single_bucket[0x81]._M_nxt = (_Hash_node_base *)0x0;
        samplers._M_h._M_single_bucket[0x82]._M_nxt = (_Hash_node_base *)0x0;
        GatherSamplers((unordered_map<unsigned_int,_AnimationSamplers,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_AnimationSamplers>_>_>
                        *)local_68,anim_00);
        sVar7 = std::
                unordered_map<unsigned_int,_AnimationSamplers,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_AnimationSamplers>_>_>
                ::size((unordered_map<unsigned_int,_AnimationSamplers,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_AnimationSamplers>_>_>
                        *)local_68);
        *(int *)&samplers._M_h._M_single_bucket[0x83]._M_nxt = (int)sVar7;
        if (*(int *)&samplers._M_h._M_single_bucket[0x83]._M_nxt != 0) {
          p_Var8 = (_Hash_node_base *)
                   operator_new__((ulong)*(uint *)&samplers._M_h._M_single_bucket[0x83]._M_nxt << 3)
          ;
          samplers._M_h._M_single_bucket[0x84]._M_nxt = p_Var8;
          __range3._0_4_ = 0;
          __end3 = std::
                   unordered_map<unsigned_int,_AnimationSamplers,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_AnimationSamplers>_>_>
                   ::begin((unordered_map<unsigned_int,_AnimationSamplers,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_AnimationSamplers>_>_>
                            *)local_68);
          iter = (pair<const_unsigned_int,_AnimationSamplers> *)
                 std::
                 unordered_map<unsigned_int,_AnimationSamplers,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_AnimationSamplers>_>_>
                 ::end((unordered_map<unsigned_int,_AnimationSamplers,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_AnimationSamplers>_>_>
                        *)local_68);
          while (bVar3 = std::__detail::operator!=
                                   (&__end3.
                                     super__Node_iterator_base<std::pair<const_unsigned_int,_AnimationSamplers>,_false>
                                    ,(_Node_iterator_base<std::pair<const_unsigned_int,_AnimationSamplers>,_false>
                                      *)&iter), bVar3) {
            maxDuration = (double)std::__detail::
                                  _Node_iterator<std::pair<const_unsigned_int,_AnimationSamplers>,_false,_false>
                                  ::operator*(&__end3);
            node = glTF2::LazyDict<glTF2::Node>::operator[]
                             (&r->nodes,(ulong)((reference)maxDuration)->first);
            paVar9 = CreateNodeAnim(r,node,(AnimationSamplers *)((long)maxDuration + 8));
            samplers._M_h._M_single_bucket[0x84]._M_nxt[(int)__range3]._M_nxt =
                 (_Hash_node_base *)paVar9;
            __range3._0_4_ = (int)__range3 + 1;
            std::__detail::
            _Node_iterator<std::pair<const_unsigned_int,_AnimationSamplers>,_false,_false>::
            operator++(&__end3);
          }
        }
        _j_1 = (_Hash_node_base *)0x0;
        chan._4_4_ = 0;
        for (chan._0_4_ = 0; (uint)chan < *(uint *)&samplers._M_h._M_single_bucket[0x83]._M_nxt;
            chan._0_4_ = (uint)chan + 1) {
          p_Var8 = samplers._M_h._M_single_bucket[0x84]._M_nxt[(uint)chan]._M_nxt;
          if (*(int *)((long)&p_Var8[0x80]._M_nxt + 4) != 0) {
            p_Var1 = p_Var8[0x81]._M_nxt[(ulong)(*(int *)((long)&p_Var8[0x80]._M_nxt + 4) - 1) * 3].
                     _M_nxt;
            if ((double)_j_1 < (double)p_Var1) {
              _j_1 = p_Var1;
            }
            puVar10 = std::max<unsigned_int>
                                ((uint *)((long)&chan + 4),(uint *)((long)&p_Var8[0x80]._M_nxt + 4))
            ;
            chan._4_4_ = *puVar10;
          }
          if (*(int *)&p_Var8[0x82]._M_nxt != 0) {
            p_Var1 = p_Var8[0x83]._M_nxt[(ulong)(*(int *)&p_Var8[0x82]._M_nxt - 1) * 3]._M_nxt;
            if ((double)_j_1 < (double)p_Var1) {
              _j_1 = p_Var1;
            }
            puVar10 = std::max<unsigned_int>((uint *)((long)&chan + 4),(uint *)(p_Var8 + 0x82));
            chan._4_4_ = *puVar10;
          }
          if (*(int *)&p_Var8[0x84]._M_nxt != 0) {
            p_Var1 = p_Var8[0x85]._M_nxt[(ulong)(*(int *)&p_Var8[0x84]._M_nxt - 1) * 3]._M_nxt;
            if ((double)_j_1 < (double)p_Var1) {
              _j_1 = p_Var1;
            }
            puVar10 = std::max<unsigned_int>((uint *)((long)&chan + 4),(uint *)(p_Var8 + 0x84));
            chan._4_4_ = *puVar10;
          }
        }
        samplers._M_h._M_single_bucket[0x81]._M_nxt = _j_1;
        if ((chan._4_4_ == 0) || ((double)_j_1 <= 0.0)) {
          local_150 = (_Hash_node_base *)0x403e000000000000;
        }
        else {
          local_150 = (_Hash_node_base *)((double)chan._4_4_ / ((double)_j_1 / 1000.0));
        }
        samplers._M_h._M_single_bucket[0x82]._M_nxt = local_150;
        this->mScene->mAnimations[anim._4_4_] = (aiAnimation *)samplers._M_h._M_single_bucket;
        std::
        unordered_map<unsigned_int,_AnimationSamplers,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_AnimationSamplers>_>_>
        ::~unordered_map((unordered_map<unsigned_int,_AnimationSamplers,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_AnimationSamplers>_>_>
                          *)local_68);
      }
    }
  }
  return;
}

Assistant:

void glTF2Importer::ImportAnimations(glTF2::Asset& r)
{
    if (!r.scene) return;

    mScene->mNumAnimations = r.animations.Size();
    if (mScene->mNumAnimations == 0) {
        return;
    }

    mScene->mAnimations = new aiAnimation*[mScene->mNumAnimations];
    for (unsigned int i = 0; i < r.animations.Size(); ++i) {
        Animation& anim = r.animations[i];

        aiAnimation* ai_anim = new aiAnimation();
        ai_anim->mName = anim.name;
        ai_anim->mDuration = 0;
        ai_anim->mTicksPerSecond = 0;

        std::unordered_map<unsigned int, AnimationSamplers> samplers = GatherSamplers(anim);

        ai_anim->mNumChannels = static_cast<uint32_t>(samplers.size());
        if (ai_anim->mNumChannels > 0) {
            ai_anim->mChannels = new aiNodeAnim*[ai_anim->mNumChannels];
            int j = 0;
            for (auto& iter : samplers) {
                ai_anim->mChannels[j] = CreateNodeAnim(r, r.nodes[iter.first], iter.second);
                ++j;
            }
        }

        // Use the latest keyframe for the duration of the animation
        double maxDuration = 0;
        unsigned int maxNumberOfKeys = 0;
        for (unsigned int j = 0; j < ai_anim->mNumChannels; ++j) {
            auto chan = ai_anim->mChannels[j];
            if (chan->mNumPositionKeys) {
                auto lastPosKey = chan->mPositionKeys[chan->mNumPositionKeys - 1];
                if (lastPosKey.mTime > maxDuration) {
                    maxDuration = lastPosKey.mTime;
                }
                maxNumberOfKeys = std::max(maxNumberOfKeys, chan->mNumPositionKeys);
            }
            if (chan->mNumRotationKeys) {
                auto lastRotKey = chan->mRotationKeys[chan->mNumRotationKeys - 1];
                if (lastRotKey.mTime > maxDuration) {
                    maxDuration = lastRotKey.mTime;
                }
                maxNumberOfKeys = std::max(maxNumberOfKeys, chan->mNumRotationKeys);
            }
            if (chan->mNumScalingKeys) {
                auto lastScaleKey = chan->mScalingKeys[chan->mNumScalingKeys - 1];
                if (lastScaleKey.mTime > maxDuration) {
                    maxDuration = lastScaleKey.mTime;
                }
                maxNumberOfKeys = std::max(maxNumberOfKeys, chan->mNumScalingKeys);
            }
        }
        ai_anim->mDuration = maxDuration;
        ai_anim->mTicksPerSecond = (maxNumberOfKeys > 0 && maxDuration > 0) ? (maxNumberOfKeys / (maxDuration/1000)) : 30;

        mScene->mAnimations[i] = ai_anim;
    }
}